

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O2

void __thiscall chrono::ChParticleCloud::VariablesFbLoadForces(ChParticleCloud *this,double factor)

{
  ChSystem *pCVar1;
  pointer ppCVar2;
  ChAparticle *pCVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  ulong uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double factor_local;
  ChVector<double> v;
  ChVector<double> *local_108 [2];
  double local_f8;
  double dStack_f0;
  ChVector<double> Wvel;
  double local_b0;
  double local_a8;
  double dStack_a0;
  ChVectorRef local_78;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_60;
  
  pCVar1 = (this->super_ChIndexedParticles).super_ChPhysicsItem.system;
  if (pCVar1 == (ChSystem *)0x0) {
    local_f8 = 0.0;
    dStack_f0 = 0.0;
    dVar8 = 0.0;
  }
  else {
    dVar8 = (this->particle_mass).mass;
    local_f8 = dVar8 * (pCVar1->G_acc).m_data[0];
    dStack_f0 = dVar8 * (pCVar1->G_acc).m_data[1];
    dVar8 = dVar8 * (pCVar1->G_acc).m_data[2];
  }
  uVar6 = 0;
  factor_local = factor;
  while( true ) {
    uVar7 = (ulong)uVar6;
    ppCVar2 = (this->particles).
              super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->particles).
                      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3) <= uVar7)
    break;
    ChFrameMoving<double>::GetWvel_loc(&Wvel,(ChFrameMoving<double> *)ppCVar2[uVar7]);
    ChMatrix33<double>::operator*(&(this->particle_mass).inertia,&Wvel);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_b0;
    auVar14._8_8_ = dStack_a0;
    auVar14._0_8_ = dStack_a0;
    auVar4._8_8_ = Wvel.m_data[2];
    auVar4._0_8_ = Wvel.m_data[1];
    auVar11._8_8_ = 0;
    auVar11._0_8_ = Wvel.m_data[0];
    auVar5._8_8_ = dStack_a0;
    auVar5._0_8_ = local_a8;
    auVar12._8_8_ = Wvel.m_data[2];
    auVar12._0_8_ = Wvel.m_data[2];
    local_108[0] = &v;
    pCVar3 = (this->particles).
             super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar7];
    auVar9 = vunpcklpd_avx(auVar14,auVar9);
    auVar10 = vunpcklpd_avx(auVar12,auVar11);
    auVar13._0_8_ = local_a8 * auVar10._0_8_;
    auVar13._8_8_ = dStack_a0 * auVar10._8_8_;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_b0 * Wvel.m_data[1];
    auVar10 = vfmsub231sd_fma(auVar10,auVar11,auVar5);
    auVar9 = vfmsub213pd_fma(auVar9,auVar4,auVar13);
    v.m_data[1] = dStack_f0 + (pCVar3->UserForce).m_data[1];
    v.m_data[0] = local_f8 + (pCVar3->UserForce).m_data[0];
    v.m_data[2] = dVar8 + (pCVar3->UserForce).m_data[2];
    Eigen::operator*(&local_60,&factor_local,(StorageBaseType *)local_108);
    ChVariables::Get_fb(&local_78,
                        (ChVariables *)
                        &(this->particles).
                         super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar7]->variables);
    Eigen::
    VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
    VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
                 *)&local_b0,&local_78,0,3);
    Eigen::
    MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>,-1,1,false>>
    ::operator+=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                  *)&local_b0,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                  *)&local_60);
    pCVar3 = (this->particles).
             super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar7];
    v.m_data._0_16_ = vsubpd_avx(*(undefined1 (*) [16])(pCVar3->UserTorque).m_data,auVar9);
    local_108[0] = &v;
    v.m_data[2] = (pCVar3->UserTorque).m_data[2] - auVar10._0_8_;
    Eigen::operator*(&local_60,&factor_local,(StorageBaseType *)local_108);
    ChVariables::Get_fb(&local_78,
                        (ChVariables *)
                        &(this->particles).
                         super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar7]->variables);
    Eigen::
    VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
    VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
                 *)&local_b0,&local_78,3,3);
    Eigen::
    MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>,-1,1,false>>
    ::operator+=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                  *)&local_b0,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                  *)&local_60);
    uVar6 = uVar6 + 1;
  }
  return;
}

Assistant:

void ChParticleCloud::VariablesFbLoadForces(double factor) {
    ChVector<> Gforce;
    if (GetSystem())
        Gforce = GetSystem()->Get_G_acc() * particle_mass.GetBodyMass();

    for (unsigned int j = 0; j < particles.size(); j++) {
        // particle gyroscopic force:
        ChVector<> Wvel = particles[j]->GetWvel_loc();
        ChVector<> gyro = Vcross(Wvel, particle_mass.GetBodyInertia() * Wvel);

        // add applied forces and torques (and also the gyroscopic torque and gravity!) to 'fb' vector
        particles[j]->variables.Get_fb().segment(0, 3) += factor * (particles[j]->UserForce + Gforce).eigen();
        particles[j]->variables.Get_fb().segment(3, 3) += factor * (particles[j]->UserTorque - gyro).eigen();
    }
}